

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_FADD_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  AssemblyGeneratorX86 *unaff_retaddr;
  
  in_RSI->dst = in_RSI->dst % 4;
  genAddressReg(unaff_retaddr,(Instruction *)in_RDI,(char *)in_RSI);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tcvtdq2pd ");
  poVar1 = std::operator<<(poVar1,tempRegx);
  poVar1 = std::operator<<(poVar1,", qword ptr [");
  poVar1 = std::operator<<(poVar1,regScratchpadAddr);
  poVar1 = std::operator<<(poVar1,"+rax]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\taddpd ");
  poVar1 = std::operator<<(poVar1,*(char **)(regF + (ulong)in_RSI->dst * 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,tempRegx);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  traceflt(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FADD_M(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		genAddressReg(instr);
		asmCode << "\tcvtdq2pd " << tempRegx << ", qword ptr [" << regScratchpadAddr << "+rax]" << std::endl;
		asmCode << "\taddpd " << regF[instr.dst] << ", " << tempRegx << std::endl;
		traceflt(instr);
	}